

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implicit_weak_message.h
# Opt level: O0

size_t __thiscall
google::protobuf::internal::ImplicitWeakMessage::ByteSizeLong(ImplicitWeakMessage *this)

{
  int desired;
  size_t local_28;
  size_t size;
  ImplicitWeakMessage *this_local;
  
  if (this->data_ == (string *)0x0) {
    local_28 = 0;
  }
  else {
    local_28 = std::__cxx11::string::size();
  }
  desired = ToCachedSize(local_28);
  CachedSize::Set(&this->cached_size_,desired);
  return local_28;
}

Assistant:

size_t ByteSizeLong() const PROTOBUF_FINAL {
    size_t size = data_ == nullptr ? 0 : data_->size();
    cached_size_.Set(internal::ToCachedSize(size));
    return size;
  }